

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
               (long *idata,AggregateInputData *aggr_input_data,
               ModeState<long,_duckdb::ModeStandard<long>_> **states,ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
      BaseModeFunction<duckdb::ModeStandard<long>>::
      Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
                (states[iVar6],idata,aggr_input_data);
      idata = idata + 1;
    }
  }
  else {
    uVar5 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
LAB_01c2a47c:
        plVar7 = idata + uVar5;
        for (; uVar3 = uVar5, uVar5 < uVar8; uVar5 = uVar5 + 1) {
          BaseModeFunction<duckdb::ModeStandard<long>>::
          Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
                    (states[uVar5],plVar7,aggr_input_data);
          plVar7 = plVar7 + 1;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01c2a47c;
        uVar3 = uVar8;
        if (uVar2 != 0) {
          plVar7 = idata + uVar5;
          for (uVar9 = 0; uVar3 = uVar5 + uVar9, uVar5 + uVar9 < uVar8; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              BaseModeFunction<duckdb::ModeStandard<long>>::
              Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
                        (states[uVar5 + uVar9],plVar7,aggr_input_data);
            }
            plVar7 = plVar7 + 1;
          }
        }
      }
      uVar5 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}